

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::DescriptorProto::DescriptorProto(DescriptorProto *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DescriptorProto_0028fc00;
  UnknownFieldSet::UnknownFieldSet(&this->_unknown_fields_);
  (this->field_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->field_).super_RepeatedPtrFieldBase.elements_ = (void **)0x0;
  (this->field_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->field_).super_RepeatedPtrFieldBase.allocated_size_ = 0;
  (this->extension_).super_RepeatedPtrFieldBase.elements_ = (void **)0x0;
  (this->extension_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->extension_).super_RepeatedPtrFieldBase.allocated_size_ = 0;
  (this->extension_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->nested_type_).super_RepeatedPtrFieldBase.elements_ = (void **)0x0;
  (this->nested_type_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->nested_type_).super_RepeatedPtrFieldBase.allocated_size_ = 0;
  (this->nested_type_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->enum_type_).super_RepeatedPtrFieldBase.elements_ = (void **)0x0;
  (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->enum_type_).super_RepeatedPtrFieldBase.allocated_size_ = 0;
  (this->enum_type_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->extension_range_).super_RepeatedPtrFieldBase.elements_ = (void **)0x0;
  (this->extension_range_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->extension_range_).super_RepeatedPtrFieldBase.allocated_size_ = 0;
  (this->extension_range_).super_RepeatedPtrFieldBase.total_size_ = 0;
  this->name_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->options_ = (MessageOptions *)0x0;
  this->_cached_size_ = 0;
  this->_has_bits_[0] = 0;
  return;
}

Assistant:

DescriptorProto::DescriptorProto()
  : ::google::protobuf::Message() {
  SharedCtor();
}